

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O2

void duckdb::AggregateExecutor::
     UnaryFlatUpdateLoop<duckdb::StddevState,double,duckdb::VarPopOperation>
               (double *idata,AggregateInputData *aggr_input_data,StddevState *state,idx_t count,
               ValidityMask *mask)

{
  unsigned_long *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  double *pdVar7;
  ulong uVar8;
  
  uVar8 = 0;
  uVar4 = 0;
  do {
    if (uVar8 == count + 0x3f >> 6) {
      return;
    }
    puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    if (puVar1 == (unsigned_long *)0x0) {
      uVar5 = uVar4 + 0x40;
      if (count <= uVar4 + 0x40) {
        uVar5 = count;
      }
LAB_01c047f7:
      pdVar7 = idata + uVar4;
      for (; uVar3 = uVar4, uVar4 < uVar5; uVar4 = uVar4 + 1) {
        STDDevBaseOperation::Execute<double,duckdb::StddevState>(state,pdVar7);
        pdVar7 = pdVar7 + 1;
      }
    }
    else {
      uVar2 = puVar1[uVar8];
      uVar5 = uVar4 + 0x40;
      if (count <= uVar4 + 0x40) {
        uVar5 = count;
      }
      if (uVar2 == 0xffffffffffffffff) goto LAB_01c047f7;
      uVar3 = uVar5;
      if (uVar2 != 0) {
        pdVar7 = idata + uVar4;
        for (uVar6 = 0; uVar3 = uVar4 + uVar6, uVar4 + uVar6 < uVar5; uVar6 = uVar6 + 1) {
          if ((uVar2 >> (uVar6 & 0x3f) & 1) != 0) {
            STDDevBaseOperation::Execute<double,duckdb::StddevState>(state,pdVar7);
          }
          pdVar7 = pdVar7 + 1;
        }
      }
    }
    uVar8 = uVar8 + 1;
    uVar4 = uVar3;
  } while( true );
}

Assistant:

static inline void UnaryFlatUpdateLoop(const INPUT_TYPE *__restrict idata, AggregateInputData &aggr_input_data,
	                                       STATE_TYPE *__restrict state, idx_t count, ValidityMask &mask) {
		AggregateUnaryInput input(aggr_input_data, mask);
		auto &base_idx = input.input_idx;
		base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (!OP::IgnoreNull() || ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*state, idata[base_idx], input);
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
						OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*state, idata[base_idx], input);
					}
				}
			}
		}
	}